

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_read_fuzzer.c
# Opt level: O3

int LLVMFuzzerTestOneInput(uint8_t *data,size_t size)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  void *pvVar5;
  
  if ((((4 < size) && (data[size - 1] == '\0')) && (bVar1 = *data, (bVar1 & 0xfe) == 0x30)) &&
     ((((data[1] & 0xfe) == 0x30 && (bVar2 = data[2], (bVar2 & 0xfe) == 0x30)) &&
      (bVar3 = data[3], (bVar3 & 0xfe) == 0x30)))) {
    lVar4 = cJSON_ParseWithOpts(data + 4,0,data[1] == 0x31);
    if (lVar4 != 0) {
      if (bVar3 == 0x31) {
        pvVar5 = (void *)cJSON_PrintBuffered(lVar4,1,bVar2 == 0x31);
      }
      else if (bVar2 == 0x31) {
        pvVar5 = (void *)cJSON_Print();
      }
      else {
        pvVar5 = (void *)cJSON_PrintUnformatted(lVar4);
      }
      if (pvVar5 != (void *)0x0) {
        free(pvVar5);
      }
      if (bVar1 == 0x31) {
        pvVar5 = malloc(size);
        if (pvVar5 == (void *)0x0) {
          return 0;
        }
        memcpy(pvVar5,data,size);
        cJSON_Minify((long)pvVar5 + 4);
        free(pvVar5);
      }
      cJSON_Delete(lVar4);
    }
  }
  return 0;
}

Assistant:

int LLVMFuzzerTestOneInput(const uint8_t* data, size_t size)
{
    cJSON *json;
    size_t offset = 4;
    unsigned char *copied;
    char *printed_json = NULL;
    int minify, require_termination, formatted, buffered;


    if(size <= offset) return 0;
    if(data[size-1] != '\0') return 0;
    if(data[0] != '1' && data[0] != '0') return 0;
    if(data[1] != '1' && data[1] != '0') return 0;
    if(data[2] != '1' && data[2] != '0') return 0;
    if(data[3] != '1' && data[3] != '0') return 0;

    minify              = data[0] == '1' ? 1 : 0;
    require_termination = data[1] == '1' ? 1 : 0;
    formatted           = data[2] == '1' ? 1 : 0;
    buffered            = data[3] == '1' ? 1 : 0;

    json = cJSON_ParseWithOpts((const char*)data + offset, NULL, require_termination);

    if(json == NULL) return 0;

    if(buffered)
    {
        printed_json = cJSON_PrintBuffered(json, 1, formatted);
    }
    else
    {
        /* unbuffered printing */
        if(formatted)
        {
            printed_json = cJSON_Print(json);
        }
        else
        {
            printed_json = cJSON_PrintUnformatted(json);
        }
    }

    if(printed_json != NULL) free(printed_json);

    if(minify)
    {
        copied = (unsigned char*)malloc(size);
        if(copied == NULL) return 0;

        memcpy(copied, data, size);

        cJSON_Minify((char*)copied + offset);

        free(copied);
    }

    cJSON_Delete(json);

    return 0;
}